

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O3

int socket_bind_listen(int port)

{
  int __fd;
  int iVar1;
  undefined1 local_34 [8];
  sockaddr_in server_addr;
  int optval;
  
  if (((uint)port < 0x10000) && (__fd = socket(2,1,0), __fd != -1)) {
    server_addr.sin_zero[0] = '\x01';
    server_addr.sin_zero[1] = '\0';
    server_addr.sin_zero[2] = '\0';
    server_addr.sin_zero[3] = '\0';
    iVar1 = setsockopt(__fd,1,2,server_addr.sin_zero,4);
    if (iVar1 != -1) {
      bzero((sockaddr *)local_34,0x10);
      local_34._0_2_ = 2;
      local_34[4] = '\0';
      local_34[5] = '\0';
      local_34[6] = '\0';
      local_34[7] = '\0';
      local_34._2_2_ = (ushort)port << 8 | (ushort)port >> 8;
      iVar1 = bind(__fd,(sockaddr *)local_34,0x10);
      if ((iVar1 != -1) && (iVar1 = listen(__fd,0x800), iVar1 != -1)) {
        return __fd;
      }
    }
    close(__fd);
  }
  return -1;
}

Assistant:

int socket_bind_listen(int port) {
  // 检查port值，取正确区间范围
  if (port < 0 || port > 65535) return -1;

  // 创建socket(IPv4 + TCP)，返回监听描述符
  int listen_fd = 0;
  if ((listen_fd = socket(AF_INET, SOCK_STREAM, 0)) == -1) return -1;

  // 消除bind时"Address already in use"错误
  int optval = 1;
  if (setsockopt(listen_fd, SOL_SOCKET, SO_REUSEADDR, &optval,
                 sizeof(optval)) == -1) {
    close(listen_fd);
    return -1;
  }

  // 设置服务器IP和Port，和监听描述副绑定
  struct sockaddr_in server_addr;
  bzero((char *)&server_addr, sizeof(server_addr));
  server_addr.sin_family = AF_INET;
  server_addr.sin_addr.s_addr = htonl(INADDR_ANY);
  server_addr.sin_port = htons((unsigned short)port);
  if (bind(listen_fd, (struct sockaddr *)&server_addr, sizeof(server_addr)) ==
      -1) {
    close(listen_fd);
    return -1;
  }

  // 开始监听，最大等待队列长为LISTENQ
  if (listen(listen_fd, 2048) == -1) {
    close(listen_fd);
    return -1;
  }

  // 无效监听描述符
  if (listen_fd == -1) {
    close(listen_fd);
    return -1;
  }
  return listen_fd;
}